

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementText.cpp
# Opt level: O0

bool __thiscall
Rml::ElementText::GenerateLine
          (ElementText *this,String *line,int *line_length,float *line_width,int line_begin,
          float maximum_line_width,float right_spacing_width,bool trim_whitespace_prefix,
          bool decode_escape_characters,bool allow_empty)

{
  code *pcVar1;
  undefined8 string_end_00;
  byte bVar2;
  bool bVar3;
  TextTransform text_transformation;
  WordBreak WVar4;
  uint uVar5;
  FontFaceHandle FVar6;
  Element *pEVar7;
  ComputedValues *this_00;
  FontEngineInterface *pFVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  char *pcVar12;
  char *p_begin;
  byte local_1a9;
  float local_198;
  byte local_161;
  bool local_134;
  bool local_133;
  bool local_132;
  bool local_131;
  ElementText *local_130;
  StringView local_110;
  int local_100;
  byte local_f9;
  char *pcStack_f8;
  bool force_loop_break_at_end;
  char *partial_string_end;
  int local_e8;
  int token_max_size;
  int max_token_width;
  bool is_last_token;
  char *local_d8;
  int local_cc;
  byte local_c5;
  int token_width;
  bool break_line;
  Character local_b4;
  char *pcStack_b0;
  Character previous_codepoint;
  char *next_token_begin;
  String token;
  char *string_end;
  char *token_begin;
  FontEngineInterface *font_engine_interface;
  WordBreak word_break;
  String *pSStack_68;
  TextTransform text_transform_property;
  TextShapingContext text_shaping_context;
  bool break_at_endline;
  bool break_at_line;
  bool collapse_white_space;
  WhiteSpace white_space_property;
  ComputedValues *computed;
  FontFaceHandle font_face_handle;
  bool allow_empty_local;
  bool decode_escape_characters_local;
  bool trim_whitespace_prefix_local;
  float right_spacing_width_local;
  float maximum_line_width_local;
  int line_begin_local;
  float *line_width_local;
  int *line_length_local;
  String *line_local;
  ElementText *this_local;
  
  if ((maximum_line_width < 0.0) &&
     (bVar3 = Assert("RMLUI_ASSERT(maximum_line_width >= 0.f)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementText.cpp"
                     ,0xbc), !bVar3)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  FVar6 = Element::GetFontFaceHandle(&this->super_Element);
  ::std::__cxx11::string::clear();
  *line_length = 0;
  *line_width = 0.0;
  if (FVar6 == 0) {
    pEVar7 = Element::GetParentNode(&this->super_Element);
    local_130 = this;
    if (pEVar7 != (Element *)0x0) {
      local_130 = (ElementText *)Element::GetParentNode(&this->super_Element);
    }
    LogMissingFontFace(&local_130->super_Element);
    this_local._7_1_ = 1;
  }
  else {
    this_00 = Element::GetComputedValues(&this->super_Element);
    text_shaping_context.letter_spacing._3_1_ = Style::ComputedValues::white_space(this_00);
    local_131 = true;
    if ((text_shaping_context.letter_spacing._3_1_ != Normal) &&
       (local_131 = true, text_shaping_context.letter_spacing._3_1_ != Nowrap)) {
      local_131 = text_shaping_context.letter_spacing._3_1_ == Preline;
    }
    text_shaping_context.letter_spacing._2_1_ = local_131;
    local_132 = false;
    if (0.0 <= maximum_line_width) {
      local_133 = true;
      if ((text_shaping_context.letter_spacing._3_1_ != Normal) &&
         (local_133 = true, text_shaping_context.letter_spacing._3_1_ != Prewrap)) {
        local_133 = text_shaping_context.letter_spacing._3_1_ == Preline;
      }
      local_132 = local_133;
    }
    text_shaping_context.letter_spacing._1_1_ = local_132;
    local_134 = true;
    if ((text_shaping_context.letter_spacing._3_1_ != Pre) &&
       (local_134 = true, text_shaping_context.letter_spacing._3_1_ != Prewrap)) {
      local_134 = text_shaping_context.letter_spacing._3_1_ == Preline;
    }
    text_shaping_context.letter_spacing._0_1_ = local_134;
    pSStack_68 = Style::ComputedValues::language_abi_cxx11_(this_00);
    text_shaping_context.language._0_1_ = Style::ComputedValues::direction(this_00);
    text_shaping_context.language._4_4_ = Style::ComputedValues::letter_spacing(this_00);
    text_transformation = Style::ComputedValues::text_transform(this_00);
    WVar4 = Style::ComputedValues::word_break(this_00);
    pFVar8 = GetFontEngineInterface();
    lVar9 = ::std::__cxx11::string::c_str();
    string_end = (char *)(lVar9 + line_begin);
    lVar9 = ::std::__cxx11::string::c_str();
    lVar10 = ::std::__cxx11::string::size();
    token.field_2._8_8_ = lVar9 + lVar10;
    do {
      if (string_end == (char *)token.field_2._8_8_) {
        this_local._7_1_ = 1;
        break;
      }
      ::std::__cxx11::string::string((string *)&next_token_begin);
      pcStack_b0 = string_end;
      local_b4 = Null;
      uVar11 = ::std::__cxx11::string::empty();
      if ((uVar11 & 1) == 0) {
        pcVar12 = (char *)::std::__cxx11::string::back();
        p_begin = (char *)::std::__cxx11::string::data();
        pcVar12 = StringUtilities::SeekBackwardUTF8(pcVar12,p_begin);
        lVar9 = ::std::__cxx11::string::data();
        lVar10 = ::std::__cxx11::string::size();
        local_b4 = StringUtilities::ToCharacter(pcVar12,(char *)(lVar9 + lVar10));
      }
      string_end_00 = token.field_2._8_8_;
      uVar5 = ::std::__cxx11::string::empty();
      local_161 = 0;
      bVar2 = trim_whitespace_prefix;
      if ((uVar5 & 1) == 0) {
        bVar2 = local_161;
      }
      local_161 = bVar2;
      local_c5 = BuildToken((String *)&next_token_begin,&stack0xffffffffffffff50,
                            (char *)string_end_00,(bool)(local_161 & 1),
                            (bool)(text_shaping_context.letter_spacing._2_1_ & 1),
                            (bool)(text_shaping_context.letter_spacing._0_1_ & 1),
                            text_transformation,decode_escape_characters);
      StringView::StringView((StringView *)&max_token_width,(String *)&next_token_begin);
      local_cc = (*pFVar8->_vptr_FontEngineInterface[9])
                           (pFVar8,FVar6,_max_token_width,local_d8,&stack0xffffffffffffff98,
                            (ulong)local_b4);
      if ((text_shaping_context.letter_spacing._1_1_ & 1) == 0) {
LAB_005937a5:
        ::std::__cxx11::string::operator+=((string *)line,(string *)&next_token_begin);
        *line_length = ((int)pcStack_b0 - (int)string_end) + *line_length;
        *line_width = (float)local_cc + *line_width;
        if (((local_c5 & 1) == 0) ||
           ((!allow_empty && (uVar11 = ::std::__cxx11::string::empty(), (uVar11 & 1) != 0)))) {
          string_end = pcStack_b0;
          local_100 = 0;
        }
        else {
          this_local._7_1_ = 0;
          local_100 = 1;
        }
      }
      else {
        token_max_size._3_1_ =
             LastToken(pcStack_b0,(char *)token.field_2._8_8_,
                       (bool)(text_shaping_context.letter_spacing._2_1_ & 1),
                       (bool)(text_shaping_context.letter_spacing._0_1_ & 1));
        if ((bool)token_max_size._3_1_) {
          local_198 = *line_width + right_spacing_width;
        }
        else {
          local_198 = *line_width;
        }
        local_e8 = (int)(maximum_line_width - local_198);
        if (local_cc <= local_e8) goto LAB_005937a5;
        if ((WVar4 == BreakAll) ||
           ((WVar4 == BreakWord && (uVar11 = ::std::__cxx11::string::empty(), (uVar11 & 1) != 0))))
        {
          local_e8 = (int)(maximum_line_width - *line_width);
          partial_string_end._4_4_ = (int)pcStack_b0 - (int)string_end;
          pcStack_f8 = string_end + partial_string_end._4_4_;
          do {
            pcStack_f8 = StringUtilities::SeekBackwardUTF8(pcStack_f8 + -1,string_end);
            local_f9 = 0;
            if (pcStack_f8 == string_end) {
              if ((allow_empty) || (uVar11 = ::std::__cxx11::string::empty(), (uVar11 & 1) == 0)) {
                this_local._7_1_ = 0;
                local_100 = 1;
                goto LAB_00593824;
              }
              pcStack_f8 = StringUtilities::SeekForwardUTF8
                                     (string_end + 1,string_end + partial_string_end._4_4_);
              local_f9 = 1;
            }
            ::std::__cxx11::string::clear();
            pcVar12 = pcStack_f8;
            pcStack_b0 = string_end;
            uVar5 = ::std::__cxx11::string::empty();
            local_1a9 = 0;
            bVar2 = trim_whitespace_prefix;
            if ((uVar5 & 1) == 0) {
              bVar2 = local_1a9;
            }
            local_1a9 = bVar2;
            BuildToken((String *)&next_token_begin,&stack0xffffffffffffff50,pcVar12,
                       (bool)(local_1a9 & 1),(bool)(text_shaping_context.letter_spacing._2_1_ & 1),
                       (bool)(text_shaping_context.letter_spacing._0_1_ & 1),text_transformation,
                       decode_escape_characters);
            StringView::StringView(&local_110,(String *)&next_token_begin);
            local_cc = (*pFVar8->_vptr_FontEngineInterface[9])
                                 (pFVar8,FVar6,local_110.p_begin,local_110.p_end,
                                  &stack0xffffffffffffff98,(ulong)local_b4);
          } while (((local_f9 & 1) == 0) && (local_e8 < local_cc));
          local_c5 = 1;
          goto LAB_005937a5;
        }
        if ((!allow_empty) && (uVar11 = ::std::__cxx11::string::empty(), (uVar11 & 1) != 0))
        goto LAB_005937a5;
        this_local._7_1_ = 0;
        local_100 = 1;
      }
LAB_00593824:
      ::std::__cxx11::string::~string((string *)&next_token_begin);
    } while (local_100 == 0);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ElementText::GenerateLine(String& line, int& line_length, float& line_width, int line_begin, float maximum_line_width, float right_spacing_width,
	bool trim_whitespace_prefix, bool decode_escape_characters, bool allow_empty)
{
	RMLUI_ZoneScoped;
	RMLUI_ASSERT(
		maximum_line_width >= 0.f); // TODO: Check all callers for conformance, check break at line condition below. Possibly check for FLT_MAX.

	FontFaceHandle font_face_handle = GetFontFaceHandle();

	// Initialise the output variables.
	line.clear();
	line_length = 0;
	line_width = 0;

	// Bail if we don't have a valid font face.
	if (font_face_handle == 0)
	{
		LogMissingFontFace(GetParentNode() ? GetParentNode() : this);
		return true;
	}

	// Determine how we are processing white-space while formatting the text.
	using namespace Style;
	const auto& computed = GetComputedValues();
	WhiteSpace white_space_property = computed.white_space();
	bool collapse_white_space =
		white_space_property == WhiteSpace::Normal || white_space_property == WhiteSpace::Nowrap || white_space_property == WhiteSpace::Preline;
	bool break_at_line = (maximum_line_width >= 0) &&
		(white_space_property == WhiteSpace::Normal || white_space_property == WhiteSpace::Prewrap || white_space_property == WhiteSpace::Preline);
	bool break_at_endline =
		white_space_property == WhiteSpace::Pre || white_space_property == WhiteSpace::Prewrap || white_space_property == WhiteSpace::Preline;

	const TextShapingContext text_shaping_context{computed.language(), computed.direction(), computed.letter_spacing()};
	TextTransform text_transform_property = computed.text_transform();
	WordBreak word_break = computed.word_break();

	FontEngineInterface* font_engine_interface = GetFontEngineInterface();

	// Starting at the line_begin character, we generate sections of the text (we'll call them tokens) depending on the
	// white-space parsing parameters. Each section is then appended to the line if it can fit. If not, or if an
	// endline is found (and we're processing them), then the line is ended. kthxbai!
	const char* token_begin = text.c_str() + line_begin;
	const char* string_end = text.c_str() + text.size();
	while (token_begin != string_end)
	{
		String token;
		const char* next_token_begin = token_begin;
		Character previous_codepoint = Character::Null;
		if (!line.empty())
			previous_codepoint =
				StringUtilities::ToCharacter(StringUtilities::SeekBackwardUTF8(&line.back(), line.data()), line.data() + line.size());

		// Generate the next token and determine its pixel-length.
		bool break_line = BuildToken(token, next_token_begin, string_end, line.empty() && trim_whitespace_prefix, collapse_white_space,
			break_at_endline, text_transform_property, decode_escape_characters);
		int token_width = font_engine_interface->GetStringWidth(font_face_handle, token, text_shaping_context, previous_codepoint);

		// If we're breaking to fit a line box, check if the token can fit on the line before we add it.
		if (break_at_line)
		{
			const bool is_last_token = LastToken(next_token_begin, string_end, collapse_white_space, break_at_endline);
			int max_token_width = int(maximum_line_width - (is_last_token ? line_width + right_spacing_width : line_width));

			if (token_width > max_token_width)
			{
				if (word_break == WordBreak::BreakAll || (word_break == WordBreak::BreakWord && line.empty()))
				{
					// Try to break up the word
					max_token_width = int(maximum_line_width - line_width);
					const int token_max_size = int(next_token_begin - token_begin);
					const char* partial_string_end = token_begin + token_max_size;

					// @performance: Can be made much faster. Use string width heuristics and logarithmic search.
					while (true)
					{
						partial_string_end = StringUtilities::SeekBackwardUTF8(partial_string_end - 1, token_begin);

						bool force_loop_break_at_end = false;
						if (partial_string_end == token_begin)
						{
							// Not even the first character of the token fits. Let it overflow onto the next line if we can.
							if (allow_empty || !line.empty())
								return false;

							// Continue by forcing the first character to be consumed, even though it will overflow.
							partial_string_end = StringUtilities::SeekForwardUTF8(token_begin + 1, token_begin + token_max_size);
							force_loop_break_at_end = true;
						}

						token.clear();
						next_token_begin = token_begin;
						BuildToken(token, next_token_begin, partial_string_end, line.empty() && trim_whitespace_prefix, collapse_white_space,
							break_at_endline, text_transform_property, decode_escape_characters);
						token_width = font_engine_interface->GetStringWidth(font_face_handle, token, text_shaping_context, previous_codepoint);

						if (force_loop_break_at_end || token_width <= max_token_width)
							break;
					}

					break_line = true;
				}
				else if (allow_empty || !line.empty())
				{
					// Let the token overflow into the next line.
					return false;
				}
			}
		}

		// The token can fit on the end of the line, so add it onto the end and increment our width and length counters.
		line += token;
		line_length += (int)(next_token_begin - token_begin);
		line_width += token_width;

		// Break out of the loop if an endline was forced.
		if (break_line && (allow_empty || !line.empty()))
			return false;

		// Set the beginning of the next token.
		token_begin = next_token_begin;
	}

	return true;
}